

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::declare_undefined_values(CompilerGLSL *this)

{
  size_t sVar1;
  Variant *pVVar2;
  bool bVar3;
  SPIRUndef *pSVar4;
  SPIRType *type;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  long lVar6;
  string initializer;
  LoopLock local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  TypedID<(spirv_cross::Types)0> *local_58;
  string local_50;
  
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar1 = (this->super_Compiler).ir.ids_for_type[0xc].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar1 == 0) {
    ParsedIR::LoopLock::~LoopLock(&local_a0);
  }
  else {
    local_58 = (this->super_Compiler).ir.ids_for_type[0xc].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar6 = 0;
    bVar3 = false;
    do {
      uVar5 = (ulong)*(uint *)((long)&local_58->id + lVar6);
      pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar5 * 3);
      if (pVVar2[uVar5].type == TypeUndef) {
        pSVar4 = Variant::get<spirv_cross::SPIRUndef>(pVVar2 + uVar5);
        type = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar4->super_IVariant).field_0xc);
        if (*(int *)&(type->super_IVariant).field_0xc != 1) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          local_78._M_string_length = 0;
          local_78.field_2._M_local_buf[0] = '\0';
          if ((this->options).force_zero_initialized_variables == true) {
            bVar3 = type_can_zero_initialize(this,type);
            if (bVar3) {
              (*(this->super_Compiler)._vptr_Compiler[0x33])
                        (local_98,this,(ulong)*(uint *)&(pSVar4->super_IVariant).field_0xc);
              join<char_const(&)[4],std::__cxx11::string>
                        (&local_50,(spirv_cross *)0x2f7937,(char (*) [4])local_98,ts_1);
              ::std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if (local_98[0] != local_88) {
                operator_delete(local_98[0]);
              }
            }
          }
          (*(this->super_Compiler)._vptr_Compiler[6])
                    (local_98,this,(ulong)(pSVar4->super_IVariant).self.id,1);
          (*(this->super_Compiler)._vptr_Compiler[0x1a])
                    (&local_50,this,type,local_98,(ulong)(pSVar4->super_IVariant).self.id);
          statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (this,&local_50,&local_78,(char (*) [2])0x2ddbde);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (local_98[0] != local_88) {
            operator_delete(local_98[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          bVar3 = true;
        }
      }
      lVar6 = lVar6 + 4;
    } while (sVar1 << 2 != lVar6);
    ParsedIR::LoopLock::~LoopLock(&local_a0);
    if (bVar3) {
      statement<char_const(&)[1]>(this,(char (*) [1])0x2dc0a8);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, const SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

		statement(variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
		emitted = true;
	});

	if (emitted)
		statement("");
}